

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int __thiscall ON_Material::AddTexture(ON_Material *this,ON_Texture *tx)

{
  bool bVar1;
  ON_wString *this_00;
  wchar_t *filename;
  ON_Texture *pOVar2;
  int local_1c;
  int i;
  ON_Texture *tx_local;
  ON_Material *this_local;
  
  this_00 = ON_FileReference::FullPath(&tx->m_image_file_reference);
  filename = ON_wString::operator_cast_to_wchar_t_(this_00);
  local_1c = FindTexture(this,filename,tx->m_type,-1);
  if (local_1c < 0) {
    local_1c = ON_ClassArray<ON_Texture>::Count(&(this->m_textures).super_ON_ClassArray<ON_Texture>)
    ;
    ON_ClassArray<ON_Texture>::Append(&(this->m_textures).super_ON_ClassArray<ON_Texture>,tx);
  }
  else {
    pOVar2 = ON_ClassArray<ON_Texture>::operator[]
                       (&(this->m_textures).super_ON_ClassArray<ON_Texture>,local_1c);
    ON_Texture::operator=(pOVar2,tx);
  }
  pOVar2 = ON_ClassArray<ON_Texture>::operator[]
                     (&(this->m_textures).super_ON_ClassArray<ON_Texture>,local_1c);
  bVar1 = ON_UuidIsNil(&pOVar2->m_texture_id);
  if (bVar1) {
    pOVar2 = ON_ClassArray<ON_Texture>::operator[]
                       (&(this->m_textures).super_ON_ClassArray<ON_Texture>,local_1c);
    ON_CreateUuid(&pOVar2->m_texture_id);
  }
  return local_1c;
}

Assistant:

int ON_Material::AddTexture( const ON_Texture& tx )
{
  // has to copy user data
  int i = FindTexture( static_cast< const wchar_t* >(tx.m_image_file_reference.FullPath()), tx.m_type );
  if ( i < 0 )
  {
    i = m_textures.Count();
    m_textures.Append(tx);
  }
  else
  {
    m_textures[i] = tx;
  }
  if ( ON_UuidIsNil(m_textures[i].m_texture_id) )
  {
    ON_CreateUuid(m_textures[i].m_texture_id);
  }

  return i;
}